

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcRedirectFunction(uint sourceId,uint targetId)

{
  ExternFuncInfo *pEVar1;
  ExternFuncInfo *pEVar2;
  ExternFuncInfo *srcFunc;
  ExternFuncInfo *destFunc;
  uint targetId_local;
  uint sourceId_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    targetId_local._3_1_ = '\0';
  }
  else {
    if (NULLC::currExec == 1) {
      ExecutorX86::UpdateFunctionPointer(NULLC::executorX86,sourceId,targetId);
    }
    pEVar1 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),sourceId
                       );
    pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),targetId
                       );
    pEVar1->regVmAddress = pEVar2->regVmAddress;
    pEVar1->regVmCodeSize = pEVar2->regVmCodeSize;
    pEVar1->regVmRegisters = pEVar2->regVmRegisters;
    pEVar1->funcPtrRaw = pEVar2->funcPtrRaw;
    pEVar1->funcPtrWrapTarget = pEVar2->funcPtrWrapTarget;
    pEVar1->funcPtrWrap = pEVar2->funcPtrWrap;
    targetId_local._3_1_ = '\x01';
  }
  return targetId_local._3_1_;
}

Assistant:

nullres nullcRedirectFunction(unsigned sourceId, unsigned targetId)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		executorX86->UpdateFunctionPointer(sourceId, targetId);
#endif

	ExternFuncInfo &destFunc = linker->exFunctions[sourceId];
	ExternFuncInfo &srcFunc = linker->exFunctions[targetId];

	destFunc.regVmAddress = srcFunc.regVmAddress;
	destFunc.regVmCodeSize = srcFunc.regVmCodeSize;
	destFunc.regVmRegisters = srcFunc.regVmRegisters;

	destFunc.funcPtrRaw = srcFunc.funcPtrRaw;
	destFunc.funcPtrWrapTarget = srcFunc.funcPtrWrapTarget;
	destFunc.funcPtrWrap = srcFunc.funcPtrWrap;

	return true;
}